

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# identityref.c
# Opt level: O0

void * lyplg_type_print_identityref
                 (ly_ctx *UNUSED_ctx,lyd_value *value,LY_VALUE_FORMAT format,void *prefix_data,
                 ly_bool *dynamic,size_t *value_len)

{
  LY_ERR LVar1;
  size_t sVar2;
  ly_ctx *local_48;
  char *ret;
  size_t *value_len_local;
  ly_bool *dynamic_local;
  void *prefix_data_local;
  lyd_value *plStack_20;
  LY_VALUE_FORMAT format_local;
  lyd_value *value_local;
  ly_ctx *UNUSED_ctx_local;
  
  ret = (char *)value_len;
  value_len_local = (size_t *)dynamic;
  dynamic_local = (ly_bool *)prefix_data;
  prefix_data_local._4_4_ = format;
  plStack_20 = value;
  value_local = (lyd_value *)UNUSED_ctx;
  if (format == LY_VALUE_CANON) {
    if (dynamic != (ly_bool *)0x0) {
      *dynamic = '\0';
    }
    if (value_len != (size_t *)0x0) {
      sVar2 = strlen(value->_canonical);
      *(size_t *)ret = sVar2;
    }
    UNUSED_ctx_local = (ly_ctx *)plStack_20->_canonical;
  }
  else {
    LVar1 = identityref_ident2str
                      ((value->field_2).ident,format,prefix_data,(char **)&local_48,value_len);
    if (LVar1 == LY_SUCCESS) {
      *(undefined1 *)value_len_local = 1;
      UNUSED_ctx_local = local_48;
    }
    else {
      UNUSED_ctx_local = (ly_ctx *)0x0;
    }
  }
  return UNUSED_ctx_local;
}

Assistant:

LIBYANG_API_DEF const void *
lyplg_type_print_identityref(const struct ly_ctx *UNUSED(ctx), const struct lyd_value *value, LY_VALUE_FORMAT format,
        void *prefix_data, ly_bool *dynamic, size_t *value_len)
{
    char *ret;

    if (format == LY_VALUE_CANON) {
        if (dynamic) {
            *dynamic = 0;
        }
        if (value_len) {
            *value_len = strlen(value->_canonical);
        }
        return value->_canonical;
    }

    /* print the value in the specific format */
    if (identityref_ident2str(value->ident, format, prefix_data, &ret, value_len)) {
        return NULL;
    }
    *dynamic = 1;
    return ret;
}